

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

void tokaddinc(tokcxdef *ctx,char *path,int pathlen)

{
  tokpdef *ptVar1;
  tokpdef *ptVar2;
  tokpdef *ptVar3;
  
  ptVar1 = ctx->tokcxinc;
  do {
    ptVar2 = ptVar1;
    ptVar3 = (tokpdef *)&ctx->tokcxinc;
    if (ptVar2 == (tokpdef *)0x0) break;
    ptVar1 = ptVar2->tokpnxt;
    ptVar3 = ptVar2;
  } while (ptVar2->tokpnxt != (tokpdef *)0x0);
  ptVar1 = (tokpdef *)mchalo(ctx->tokcxerr,(long)pathlen + 0xf,"tokaddinc");
  ptVar1->tokplen = pathlen;
  ptVar1->tokpnxt = (tokpdef *)0x0;
  memcpy(ptVar1->tokpdir,path,(long)pathlen);
  ptVar3->tokpnxt = ptVar1;
  return;
}

Assistant:

void tokaddinc(tokcxdef *ctx, char *path, int pathlen)
{
    tokpdef *newpath;
    tokpdef *last;
    
    /* find the tail of the include path list, if any */
    for (last = ctx->tokcxinc ; last && last->tokpnxt ;
         last = last->tokpnxt) ;
    
    /* allocate storage for and set up a new path structure */
    newpath = (tokpdef *)mchalo(ctx->tokcxerr,
                                (sizeof(tokpdef) + pathlen - 1),
                                "tokaddinc");
    newpath->tokplen = pathlen;
    newpath->tokpnxt = (tokpdef *)0;
    memcpy(newpath->tokpdir, path, (size_t)pathlen);
    
    /* link in at end of list (if no list yet, newpath becomes first entry) */
    if (last)
        last->tokpnxt = newpath;
    else
        ctx->tokcxinc = newpath;
}